

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O3

void duckdb_je_bitmap_init(bitmap_t *bitmap,bitmap_info_t *binfo,_Bool fill)

{
  uint uVar1;
  undefined7 in_register_00000011;
  size_t __n;
  
  __n = binfo->ngroups << 3;
  if ((int)CONCAT71(in_register_00000011,fill) != 0) {
    switchD_005681f0::default(bitmap,0,__n);
    return;
  }
  switchD_005681f0::default(bitmap,0xff,__n);
  uVar1 = -(int)binfo->nbits & 0x3f;
  if (uVar1 != 0) {
    bitmap[binfo->ngroups - 1] = bitmap[binfo->ngroups - 1] >> (sbyte)uVar1;
  }
  return;
}

Assistant:

void
bitmap_init(bitmap_t *bitmap, const bitmap_info_t *binfo, bool fill) {
	size_t extra;

	if (fill) {
		memset(bitmap, 0, bitmap_size(binfo));
		return;
	}

	memset(bitmap, 0xffU, bitmap_size(binfo));
	extra = (BITMAP_GROUP_NBITS - (binfo->nbits & BITMAP_GROUP_NBITS_MASK))
	    & BITMAP_GROUP_NBITS_MASK;
	if (extra != 0) {
		bitmap[binfo->ngroups - 1] >>= extra;
	}
}